

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_class_stats(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  player_class *c;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"str");
    *(wchar_t *)((long)pvVar2 + 0x68) = wVar1;
    wVar1 = parser_getint(p,"int");
    *(wchar_t *)((long)pvVar2 + 0x6c) = wVar1;
    wVar1 = parser_getint(p,"wis");
    *(wchar_t *)((long)pvVar2 + 0x70) = wVar1;
    wVar1 = parser_getint(p,"dex");
    *(wchar_t *)((long)pvVar2 + 0x74) = wVar1;
    wVar1 = parser_getint(p,"con");
    *(wchar_t *)((long)pvVar2 + 0x78) = wVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_class_stats(struct parser *p) {
	struct player_class *c = parser_priv(p);

	if (!c)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	c->c_adj[STAT_STR] = parser_getint(p, "str");
	c->c_adj[STAT_INT] = parser_getint(p, "int");
	c->c_adj[STAT_WIS] = parser_getint(p, "wis");
	c->c_adj[STAT_DEX] = parser_getint(p, "dex");
	c->c_adj[STAT_CON] = parser_getint(p, "con");
	return PARSE_ERROR_NONE;
}